

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_read_start(uv_stream_t *stream,uv_alloc_cb alloc_cb,uv_read_cb read_cb)

{
  uv_read_cb read_cb_local;
  uv_alloc_cb alloc_cb_local;
  uv_stream_t *stream_local;
  
  if (((stream->type != UV_TCP) && (stream->type != UV_NAMED_PIPE)) && (stream->type != UV_TTY)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x612,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
  }
  if ((stream->flags & 1) == 0) {
    if ((stream->flags & 0x4000) == 0) {
      stream_local._4_4_ = -0x6b;
    }
    else {
      stream->flags = stream->flags | 0x1000;
      if ((stream->io_watcher).fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x623,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
      }
      if (alloc_cb == (uv_alloc_cb)0x0) {
        __assert_fail("alloc_cb",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x624,"int uv_read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
      }
      stream->read_cb = read_cb;
      stream->alloc_cb = alloc_cb;
      uv__io_start(stream->loop,&stream->io_watcher,1);
      if (((stream->flags & 4) == 0) &&
         (stream->flags = stream->flags | 4, (stream->flags & 8) != 0)) {
        stream->loop->active_handles = stream->loop->active_handles + 1;
      }
      uv__stream_osx_interrupt_select(stream);
      stream_local._4_4_ = 0;
    }
  }
  else {
    stream_local._4_4_ = -0x16;
  }
  return stream_local._4_4_;
}

Assistant:

int uv_read_start(uv_stream_t* stream,
                  uv_alloc_cb alloc_cb,
                  uv_read_cb read_cb) {
  assert(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE ||
      stream->type == UV_TTY);

  if (stream->flags & UV_HANDLE_CLOSING)
    return UV_EINVAL;

  if (!(stream->flags & UV_HANDLE_READABLE))
    return -ENOTCONN;

  /* The UV_HANDLE_READING flag is irrelevant of the state of the tcp - it just
   * expresses the desired state of the user.
   */
  stream->flags |= UV_HANDLE_READING;

  /* TODO: try to do the read inline? */
  /* TODO: keep track of tcp state. If we've gotten a EOF then we should
   * not start the IO watcher.
   */
  assert(uv__stream_fd(stream) >= 0);
  assert(alloc_cb);

  stream->read_cb = read_cb;
  stream->alloc_cb = alloc_cb;

  uv__io_start(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_start(stream);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}